

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::deepSearchPath(Graph *this,Vertex *start,int value)

{
  Edge *pEVar1;
  
  if (start != (Vertex *)0x0) {
    for (pEVar1 = start->edgesList; pEVar1 != (Edge *)0x0; pEVar1 = pEVar1->nextEdge) {
      start->idTree = value;
      printf("no: %d\t",(ulong)(uint)start->id);
      deepSearchPath(this,pEVar1->destiny,value);
    }
    return;
  }
  puts("inicio NULL");
  return;
}

Assistant:

void Graph::deepSearchPath(Vertex *start, int value) {
    if(start==NULL)
        printf("inicio NULL\n");
    else{
        for(Edge *e = start->getEdgesList(); e != NULL; e = e->getNext()){
            start->setIdTree(value);
            printf("no: %d\t", start->getID());
            this->deepSearchPath(e->getDestiny(), value);
        }
    }
}